

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isRLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  bool bVar1;
  pointer pSVar2;
  pointer s;
  
  s = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pSVar2 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (s != pSVar2) {
    if (s != pSVar2 + -1) {
      do {
        bVar1 = isTerminal(this,s,scc);
        if (!bVar1) {
          return false;
        }
        s = s + 1;
      } while (s != pSVar2 + -1);
      pSVar2 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (pSVar2[-1].x != lhs * 2 + 1) {
      bVar1 = isTerminal(this,pSVar2 + -1,scc);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool isRLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
      
    if (allTerminal(rhs.begin(), rhs.end()-1, scc))
    {
      return ((rhs[rhs.size()-1] == EdgeSym::mkVar(lhs)) || 
              isTerminal(rhs[rhs.size()-1],scc));
    }
    else
      return false;
  }